

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool Items_SingleStringGetter(void *data,int idx,char **out_text)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  
  cVar1 = *data;
  if (idx != 0 && cVar1 != '\0') {
    iVar3 = idx + -1;
    do {
      sVar2 = strlen((char *)data);
      data = (void *)((long)data + sVar2 + 1);
      cVar1 = *data;
      bVar4 = iVar3 != 0;
      iVar3 = iVar3 + -1;
      if (cVar1 == '\0') break;
    } while (bVar4);
  }
  if ((out_text != (char **)0x0) && (cVar1 != '\0')) {
    *out_text = (char *)data;
  }
  return cVar1 != '\0';
}

Assistant:

static bool Items_SingleStringGetter(void* data, int idx, const char** out_text)
{
    // FIXME-OPT: we could pre-compute the indices to fasten this. But only 1 active combo means the waste is limited.
    const char* items_separated_by_zeros = (const char*)data;
    int items_count = 0;
    const char* p = items_separated_by_zeros;
    while (*p)
    {
        if (idx == items_count)
            break;
        p += strlen(p) + 1;
        items_count++;
    }
    if (!*p)
        return false;
    if (out_text)
        *out_text = p;
    return true;
}